

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void blogc_mkdir_recursive(char *filename)

{
  char cVar1;
  FILE *__stream;
  int iVar2;
  char *__s;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  char *pcStack_20;
  char bkp;
  char *tmp;
  char *fname;
  char *filename_local;
  
  __s = bc_strdup(filename);
  pcStack_20 = __s;
  do {
    if (*pcStack_20 == '\0') {
      free(__s);
      return;
    }
    if ((*pcStack_20 == '/') || (*pcStack_20 == '\\')) {
      cVar1 = *pcStack_20;
      *pcStack_20 = '\0';
      sVar3 = strlen(__s);
      if ((sVar3 != 0) &&
         ((iVar2 = mkdir(__s,0x1ff), iVar2 == -1 &&
          (piVar4 = __errno_location(), __stream = _stderr, *piVar4 != 0x11)))) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        fprintf(__stream,"blogc: error: failed to create output directory (%s): %s\n",__s,pcVar5);
        free(__s);
        exit(2);
      }
      *pcStack_20 = cVar1;
    }
    pcStack_20 = pcStack_20 + 1;
  } while( true );
}

Assistant:

static void
blogc_mkdir_recursive(const char *filename)
{
    char *fname = bc_strdup(filename);
    for (char *tmp = fname; *tmp != '\0'; tmp++) {
        if (*tmp != '/' && *tmp != '\\')
            continue;
#ifdef HAVE_SYS_STAT_H
        char bkp = *tmp;
        *tmp = '\0';
        if ((strlen(fname) > 0) &&
#if defined(WIN32) || defined(_WIN32)
            (-1 == mkdir(fname)) &&
#else
            (-1 == mkdir(fname, 0777)) &&
#endif
            (errno != EEXIST))
        {
            fprintf(stderr, "blogc: error: failed to create output "
                "directory (%s): %s\n", fname, strerror(errno));
            free(fname);
            exit(2);
        }
        *tmp = bkp;
#else
        // FIXME: show this warning only if actually trying to create a directory.
        fprintf(stderr, "blogc: warning: can't create output directories "
            "for your platform. please create the directories yourself.\n");
        break;
#endif
    }
    free(fname);
}